

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O2

void sysbvm_gc_iterateRoots
               (sysbvm_context_t *context,void *userdata,
               sysbvm_GCRootIterationFunction_t *iterationFunction)

{
  sysbvm_stackFrameRecord_t *stackBottomRecord;
  ulong uVar1;
  sysbvm_chunkedAllocatorChunk_s **ppsVar2;
  sysbvm_chunkedAllocatorChunk_t *psVar3;
  long lVar4;
  sysbvm_chunkedAllocatorChunk_t *psVar5;
  sysbvm_chunkedAllocatorChunk_s **ppsVar6;
  bool bVar7;
  ulong local_40;
  
  for (lVar4 = 0xb8; lVar4 != 0x2290; lVar4 = lVar4 + 8) {
    (*iterationFunction)
              (userdata,(sysbvm_tuple_t *)((long)&(context->heap).firstMallocObject + lVar4));
  }
  psVar3 = (context->heap).gcRootTableAllocator.firstChunk;
  if (psVar3 != (sysbvm_chunkedAllocatorChunk_t *)0x0) goto LAB_0011b54c;
  psVar5 = (sysbvm_chunkedAllocatorChunk_t *)0x0;
  uVar1 = 0;
  do {
    uVar1 = uVar1 >> 3;
    do {
      if (psVar3 == (sysbvm_chunkedAllocatorChunk_t *)0x0) {
        psVar3 = (context->heap).picTableAllocator.firstChunk;
        if (psVar3 != (sysbvm_chunkedAllocatorChunk_t *)0x0) goto LAB_0011b607;
        psVar5 = (sysbvm_chunkedAllocatorChunk_t *)0x0;
        local_40 = 0;
        do {
          local_40 = local_40 / 0x68;
          do {
            if (psVar3 == (sysbvm_chunkedAllocatorChunk_t *)0x0) {
              stackBottomRecord = sysbvm_stackFrame_getActiveRecord();
              sysbvm_stackFrame_iterateGCRootsInStackWith
                        (stackBottomRecord,userdata,iterationFunction);
              return;
            }
            ppsVar2 = &psVar5->executableMapping;
            for (uVar1 = 0; uVar1 != local_40; uVar1 = uVar1 + 1) {
              lVar4 = 4;
              ppsVar6 = ppsVar2;
              while (bVar7 = lVar4 != 0, lVar4 = lVar4 + -1, bVar7) {
                (*iterationFunction)(userdata,(sysbvm_tuple_t *)(ppsVar6 + -2));
                (*iterationFunction)(userdata,(sysbvm_tuple_t *)(ppsVar6 + -1));
                (*iterationFunction)(userdata,(sysbvm_tuple_t *)ppsVar6);
                ppsVar6 = ppsVar6 + 3;
              }
              ppsVar2 = ppsVar2 + 0xd;
            }
            psVar3 = psVar3->next;
            psVar5 = (sysbvm_chunkedAllocatorChunk_t *)0x0;
            local_40 = 0;
          } while (psVar3 == (sysbvm_chunkedAllocatorChunk_s *)0x0);
LAB_0011b607:
          local_40 = psVar3->size;
          psVar5 = psVar3 + 1;
        } while( true );
      }
      while (bVar7 = uVar1 != 0, uVar1 = uVar1 - 1, bVar7) {
        (*iterationFunction)(userdata,(sysbvm_tuple_t *)psVar5);
        psVar5 = (sysbvm_chunkedAllocatorChunk_t *)&psVar5->next;
      }
      psVar3 = psVar3->next;
      psVar5 = (sysbvm_chunkedAllocatorChunk_t *)0x0;
      uVar1 = 0;
    } while (psVar3 == (sysbvm_chunkedAllocatorChunk_s *)0x0);
LAB_0011b54c:
    uVar1 = psVar3->size;
    psVar5 = psVar3 + 1;
  } while( true );
}

Assistant:

SYSBVM_API void sysbvm_gc_iterateRoots(sysbvm_context_t *context, void *userdata, sysbvm_GCRootIterationFunction_t iterationFunction)
{
    // Context roots.
    {
        sysbvm_tuple_t *contextRoots = (sysbvm_tuple_t*)&context->roots;
        size_t contextRootCount = sizeof(context->roots) / sizeof(sysbvm_tuple_t);
        for(size_t i = 0; i < contextRootCount; ++i)
            iterationFunction(userdata, &contextRoots[i]);
    }

    // GC Root table
    {
        sysbvm_chunkedAllocatorIterator_t iterator;
        for(sysbvm_chunkedAllocatorIterator_begin(&context->heap.gcRootTableAllocator, &iterator);
            sysbvm_chunkedAllocatorIterator_isValid(&iterator);
            sysbvm_chunkedAllocatorIterator_advance(&iterator))
        {
            size_t entryCount = iterator.size / sizeof(sysbvm_tuple_t);
            sysbvm_tuple_t *entries = (sysbvm_tuple_t*)iterator.data;
            for(size_t i = 0; i < entryCount; ++i)
                iterationFunction(userdata, entries + i);
        }
    }

    // PIC table
    {
        sysbvm_chunkedAllocatorIterator_t iterator;
        for(sysbvm_chunkedAllocatorIterator_begin(&context->heap.picTableAllocator, &iterator);
            sysbvm_chunkedAllocatorIterator_isValid(&iterator);
            sysbvm_chunkedAllocatorIterator_advance(&iterator))
        {
            size_t picCount = iterator.size / sizeof(sysbvm_pic_t);
            sysbvm_pic_t *pics = (sysbvm_pic_t*)iterator.data;
            for(size_t i = 0; i < picCount; ++i)
            {
                sysbvm_pic_t *pic = pics + i;
                for(size_t j = 0; j < SYSBVM_PIC_ENTRY_COUNT; ++j)
                {
                    sysbvm_picEntry_t *picEntry = pic->entries + j;
                    iterationFunction(userdata, &picEntry->selector);
                    iterationFunction(userdata, &picEntry->type);
                    iterationFunction(userdata, &picEntry->method);
                }
            }
        }
    }

    // Stack roots.
    sysbvm_stackFrame_iterateGCRootsInStackWith(sysbvm_stackFrame_getActiveRecord(), userdata, iterationFunction);
}